

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O3

JL_STATUS UnmarshalObject(JlDataObject *Object,JlMarshallElement *Description,
                         _Bool IgnoreExistingValuesInStruct,void *Output,size_t *pErrorAtPos)

{
  JL_NUM_TYPE JVar1;
  ulong __n;
  JL_STATUS JVar2;
  JL_DATA_TYPE JVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  uint8_t *OutputU8;
  char *local_40;
  char *local_38;
  
  JVar3 = Description->Type;
  JVar2 = JL_STATUS_INVALID_TYPE;
  switch(JVar3) {
  case JL_DATA_TYPE_STRING:
    __n = Description->FieldSize;
    if (__n == 0) {
      local_40 = (char *)0x0;
      if ((!IgnoreExistingValuesInStruct) && (*Output != (void *)0x0)) {
        WjTestLib_Free(*Output);
        *(undefined8 *)Output = 0;
      }
      JVar2 = JlGetObjectString(Object,&local_40);
      if ((JVar2 == JL_STATUS_SUCCESS) && (JVar2 = JL_STATUS_SUCCESS, local_40 != (char *)0x0)) {
        pcVar5 = JlStrDup(local_40);
        if (pcVar5 == (char *)0x0) {
          JVar2 = JL_STATUS_OUT_OF_MEMORY;
        }
        else {
          *(char **)Output = pcVar5;
        }
      }
    }
    else {
      local_40 = (char *)0x0;
      memset(Output,0,__n);
      JVar2 = JlGetObjectString(Object,&local_40);
      if (JVar2 == JL_STATUS_SUCCESS) {
        if (local_40 == (char *)0x0) {
          JVar2 = JL_STATUS_SUCCESS;
          memset(Output,0,__n);
        }
        else if (Output == (void *)0x0) {
          JVar2 = JL_STATUS_INVALID_PARAMETER;
        }
        else {
          local_38 = local_40;
          sVar4 = strlen(local_40);
          JVar2 = JL_STATUS_BUFFER_TOO_SMALL;
          if (sVar4 < __n) {
            strcpy((char *)Output,local_38);
            goto LAB_00104e7f;
          }
        }
      }
    }
    break;
  case JL_DATA_TYPE_NUMBER:
    JVar1 = Description->NumberType;
    if (JVar1 == JL_NUM_TYPE_FLOAT) {
      sVar6 = Description->FieldSize;
      local_40 = (char *)0x0;
      JVar2 = JlGetObjectNumberF64(Object,(double *)&local_40);
      if (JVar2 == JL_STATUS_SUCCESS) {
        if (sVar6 == 4) {
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if (((double)local_40 <= 3.4028234663852886e+38) &&
             (1.1754943508222875e-38 <= (double)local_40)) {
            *(float *)Output = (float)(double)local_40;
            goto LAB_00104e7f;
          }
        }
        else {
          JVar2 = JL_STATUS_INVALID_SPECIFICATION;
          if (sVar6 == 8) {
            *(char **)Output = local_40;
            goto LAB_00104e7f;
          }
        }
      }
    }
    else if (JVar1 == JL_NUM_TYPE_SIGNED) {
      sVar6 = Description->FieldSize;
      local_40 = (char *)0x0;
      JVar2 = JlGetObjectNumberS64(Object,(int64_t *)&local_40);
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JL_STATUS_INVALID_SPECIFICATION;
        switch(sVar6) {
        case 1:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if ((char *)(long)(char)local_40 == local_40) {
LAB_00104df6:
            *(char *)Output = (char)local_40;
            goto LAB_00104e7f;
          }
          break;
        case 2:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if ((char *)(long)(short)local_40 == local_40) {
LAB_00104f2a:
            *(short *)Output = (short)local_40;
            goto LAB_00104e7f;
          }
          break;
        case 4:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if ((char *)(long)(int)local_40 == local_40) {
LAB_00104f4b:
            *(int *)Output = (int)local_40;
            goto LAB_00104e7f;
          }
          break;
        case 8:
switchD_00104cfa_caseD_8:
          pcVar5 = local_40;
          goto LAB_00104e7b;
        }
      }
    }
    else {
      JVar3 = JL_DATA_TYPE_NUMBER;
      if (JVar1 != JL_NUM_TYPE_UNSIGNED) goto switchD_00104bc5_caseD_4;
      sVar6 = Description->FieldSize;
      local_40 = (char *)0x0;
      JVar2 = JlGetObjectNumberU64(Object,(uint64_t *)&local_40);
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JL_STATUS_INVALID_SPECIFICATION;
        switch(sVar6) {
        case 1:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if (local_40 < (char *)0x100) goto LAB_00104df6;
          break;
        case 2:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if (local_40 < (char *)0x10000) goto LAB_00104f2a;
          break;
        case 4:
          JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
          if ((ulong)local_40 >> 0x20 == 0) goto LAB_00104f4b;
          break;
        case 8:
          goto switchD_00104cfa_caseD_8;
        }
      }
    }
    break;
  case JL_DATA_TYPE_BOOL:
    sVar6 = Description->FieldSize;
    local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
    JVar2 = JlGetObjectBool(Object,(_Bool *)&local_40);
    if (JVar2 == JL_STATUS_SUCCESS) {
      JVar2 = JL_STATUS_INVALID_SPECIFICATION;
      switch(sVar6) {
      case 1:
        *(byte *)Output = (byte)local_40;
        break;
      case 2:
        *(ushort *)Output = (ushort)(byte)local_40;
        break;
      default:
        goto switchD_00104c85_caseD_3;
      case 4:
        *(uint *)Output = (uint)(byte)local_40;
        break;
      case 8:
        pcVar5 = (char *)((ulong)local_40 & 0xff);
LAB_00104e7b:
        *(char **)Output = pcVar5;
      }
LAB_00104e7f:
      JVar2 = JL_STATUS_SUCCESS;
    }
    break;
  default:
    goto switchD_00104bc5_caseD_4;
  case JL_DATA_TYPE_DICTIONARY:
    JVar2 = UnmarshallDictionary
                      (Object,Description->ChildStructDescription,
                       (ulong)Description->ChildStructDescriptionCount,IgnoreExistingValuesInStruct,
                       Output,pErrorAtPos);
  }
switchD_00104c85_caseD_3:
  if (JVar2 == JL_STATUS_SUCCESS) {
    JVar2 = JL_STATUS_SUCCESS;
  }
  else {
    JVar3 = Description->Type;
switchD_00104bc5_caseD_4:
    if ((pErrorAtPos != (size_t *)0x0) && (JVar3 != JL_DATA_TYPE_DICTIONARY)) {
      sVar6 = JlGetObjectTag(Object);
      *pErrorAtPos = sVar6;
    }
  }
  return JVar2;
}

Assistant:

static
JL_STATUS
    UnmarshalObject
    (
        JlDataObject const*         Object,
        JlMarshallElement const*    Description,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Output,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if( JL_DATA_TYPE_STRING == Description->Type  &&  0 == Description->FieldSize )
    {
        // Regular allocated string.
        // Output is a pointer to a string.
        jlStatus = UnmarshalString( Object, IgnoreExistingValuesInStruct, Output );
    }
    else if( JL_DATA_TYPE_STRING == Description->Type  &&  Description->FieldSize > 0 )
    {
        // Special case: This is a fixed size string in a structure
        jlStatus = UnmarshalStringFixed( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_UNSIGNED == Description->NumberType )
    {
        jlStatus = UnmarshalUnsigned( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_SIGNED == Description->NumberType )
    {
        jlStatus = UnmarshalSigned( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type  &&  JL_NUM_TYPE_FLOAT == Description->NumberType )
    {
        jlStatus = UnmarshalFloat( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_BOOL == Description->Type )
    {
        jlStatus = UnmarshalBool( Object, Output, Description->FieldSize );
    }
    else if( JL_DATA_TYPE_DICTIONARY == Description->Type )
    {
        jlStatus = UnmarshallDictionary(
            Object,
            Description->ChildStructDescription, Description->ChildStructDescriptionCount,
            IgnoreExistingValuesInStruct,
            Output,
            pErrorAtPos );
    }
    else
    {
        // Unknown data type
        jlStatus = JL_STATUS_INVALID_TYPE;
    }

    if(     JL_STATUS_SUCCESS != jlStatus
        &&  JL_DATA_TYPE_DICTIONARY != Description->Type
        &&  NULL != pErrorAtPos )
    {
        *pErrorAtPos = JlGetObjectTag( Object );
    }

    return jlStatus;
}